

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMParentNode::appendChildFast(DOMParentNode *this,DOMNode *newChild)

{
  DOMNodeImpl *pDVar1;
  DOMChildNode *pDVar2;
  DOMNode *pDVar3;
  
  pDVar3 = this->fContainingNode;
  pDVar1 = castToNodeImpl(newChild);
  pDVar1->fOwnerNode = pDVar3;
  pDVar1 = castToNodeImpl(newChild);
  pDVar1->flags = pDVar1->flags | 8;
  if (this->fFirstChild == (DOMNode *)0x0) {
    this->fFirstChild = newChild;
    pDVar1 = castToNodeImpl(newChild);
    pDVar1->flags = pDVar1->flags | 0x10;
    pDVar3 = newChild;
  }
  else {
    pDVar2 = castToChildImpl(this->fFirstChild);
    pDVar3 = pDVar2->previousSibling;
    pDVar2 = castToChildImpl(pDVar3);
    pDVar2->nextSibling = newChild;
    pDVar2 = castToChildImpl(newChild);
    pDVar2->previousSibling = pDVar3;
    pDVar3 = this->fFirstChild;
  }
  pDVar2 = castToChildImpl(pDVar3);
  pDVar2->previousSibling = newChild;
  return newChild;
}

Assistant:

DOMNode * DOMParentNode::appendChildFast(DOMNode *newChild)
{
    // This function makes the following assumptions:
    //
    // - newChild != 0
    // - newChild is not read-only
    // - newChild is not a document fragment
    // - owner documents of this node and newChild are the same
    // - appending newChild to this node cannot result in a cycle
    // - DOMDocumentImpl::isKidOK (this, newChild) return true (that is,
    //   appending newChild to this node results in a valid structure)
    // - newChild->getParentNode() is 0
    // - there are no ranges set for this document
    //

    // Attach up
    castToNodeImpl(newChild)->fOwnerNode = getContainingNode();
    castToNodeImpl(newChild)->isOwned(true);

    // Attach before and after
    // Note: fFirstChild.previousSibling == lastChild!!
    if (fFirstChild != 0)
    {
        DOMNode *lastChild = castToChildImpl(fFirstChild)->previousSibling;
        castToChildImpl(lastChild)->nextSibling = newChild;
        castToChildImpl(newChild)->previousSibling = lastChild;
        castToChildImpl(fFirstChild)->previousSibling = newChild;
    }
    else
    {
        // this our first and only child
        fFirstChild = newChild;
        castToNodeImpl(newChild)->isFirstChild(true);
        // castToChildImpl(newChild)->previousSibling = newChild;
        DOMChildNode *newChild_ci = castToChildImpl(newChild);
        newChild_ci->previousSibling = newChild;
    }

    return newChild;
}